

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall xLearn::Solver::checker(Solver *this,int argc,char **argv)

{
  bool bVar1;
  string local_38;
  
  Checker::Initialize(&this->checker_,(this->hyper_param_).is_train,argc,argv);
  bVar1 = Checker::check_cmd(&this->checker_,&this->hyper_param_);
  if (bVar1) {
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Arguments error","");
  Color::print_error(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  exit(0);
}

Assistant:

void Solver::checker(int argc, char* argv[]) {
  try {
    checker_.Initialize(hyper_param_.is_train, argc, argv);
    if (!checker_.check_cmd(hyper_param_)) {
      Color::print_error("Arguments error");
      exit(0);
    }
  } catch (std::invalid_argument &e) {
    printf("%s\n", e.what());
    exit(1);
  }
}